

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void learn_batch(lda *l)

{
  shared_data *psVar1;
  long lVar2;
  __normal_iterator<index_feature_*,_std::vector<index_feature,_std::allocator<index_feature>_>_>
  __first;
  reference pvVar3;
  bool bVar4;
  uint32_t uVar5;
  example **ppeVar6;
  size_t sVar7;
  uint64_t uVar8;
  weight *pwVar9;
  float *pfVar10;
  example *peVar11;
  example *peVar12;
  float **ppfVar13;
  vw *pvVar14;
  int *piVar15;
  reference pvVar16;
  parameters *ppVar17;
  float *pfVar18;
  vw *in_RDI;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  size_t k_6;
  float new_value_1;
  size_t k_5;
  float c_w;
  float *u_for_w_1;
  float *v_s;
  float new_value;
  size_t k_4;
  float *word_weights;
  index_feature *next;
  index_feature *s_1;
  float score;
  size_t d_1;
  size_t k_3;
  float *u_for_w;
  float decay;
  float decay_component;
  float *weights_for_w;
  index_feature *s;
  uint64_t last_weight_index;
  size_t i_1;
  float additional;
  size_t batch_size;
  size_t k_2;
  size_t k_1;
  weight *w;
  size_t i;
  size_t stride;
  size_t k;
  float minuseta;
  float eta;
  size_t d;
  parameters *weights;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  __normal_iterator<index_feature_*,_std::vector<index_feature,_std::allocator<index_feature>_>_>
  in_stack_fffffffffffffe08;
  parameters *this;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  reference in_stack_fffffffffffffe18;
  vector<index_feature,_std::allocator<index_feature>_> *in_stack_fffffffffffffe20;
  lda *this_00;
  example *in_stack_fffffffffffffe78;
  vw *in_stack_fffffffffffffe80;
  float local_150;
  ulong local_128;
  ulong local_118;
  float *local_108;
  ulong local_f0;
  float *local_e8;
  reference local_d8;
  size_t local_c8;
  ulong in_stack_ffffffffffffff40;
  example *in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  v_array<float> *in_stack_ffffffffffffff58;
  example *l_00;
  uchar *local_98;
  ulong local_88;
  ulong local_58;
  ulong local_50;
  ulong local_40;
  ulong local_28;
  ulong uVar25;
  ulong i_00;
  v_array<float> *this_01;
  
  this_01 = (v_array<float> *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3590);
  bVar4 = std::vector<index_feature,_std::allocator<index_feature>_>::empty
                    ((vector<index_feature,_std::allocator<index_feature>_> *)
                     CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  if (bVar4) {
    uVar25 = 0;
    while (i_00 = uVar25,
          sVar7 = v_array<example_*>::size((v_array<example_*> *)&in_RDI->num_children),
          uVar25 < sVar7) {
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      v_array<float>::clear
                ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      v_array<float>::resize(this_01,i_00);
      ppeVar6 = v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      ppfVar13 = v_array<float>::begin(&((*ppeVar6)->pred).scalars);
      memset(*ppfVar13,0,(long)in_RDI->sd << 2);
      ppeVar6 = v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      ppfVar13 = v_array<float>::begin(&((*ppeVar6)->pred).scalars);
      pfVar10 = *ppfVar13;
      psVar1 = in_RDI->sd;
      ppeVar6 = v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      ppfVar13 = v_array<float>::end(&((*ppeVar6)->pred).scalars);
      *ppfVar13 = pfVar10 + (long)psVar1;
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      v_array<float>::clear
                ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,i_00);
      return_example(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      uVar25 = i_00 + 1;
    }
    v_array<example_*>::clear
              ((v_array<example_*> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  else {
    sVar7 = v_array<float>::size((v_array<float> *)&(in_RDI->id)._M_string_length);
    if (sVar7 == 0) {
      for (local_28 = 0;
          local_28 < *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
          local_28 = local_28 + 1) {
        v_array<float>::push_back
                  ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      }
      uVar5 = parameters::stride((parameters *)
                                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      for (local_40 = 0;
          uVar8 = parameters::mask((parameters *)
                                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)),
          local_40 <= uVar8; local_40 = uVar5 + local_40) {
        pwVar9 = parameters::operator[]
                           ((parameters *)in_stack_fffffffffffffe08._M_current,
                            CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        for (local_50 = 0;
            local_50 <
            *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
            local_50 = local_50 + 1) {
          fVar20 = pwVar9[local_50];
          pfVar10 = v_array<float>::operator[]
                              ((v_array<float> *)&(in_RDI->id)._M_string_length,local_50);
          *pfVar10 = fVar20 + *pfVar10;
        }
      }
    }
    *(double *)&(in_RDI->trace_message).super_ostream.field_0xa0 =
         *(double *)&(in_RDI->trace_message).super_ostream.field_0xa0 + 1.0;
    v_array<float>::clear
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    for (local_58 = 0;
        local_58 < *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
        local_58 = local_58 + 1) {
      v_array<float>::push_back
                ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    sVar7 = v_array<example_*>::size((v_array<example_*> *)&in_RDI->num_children);
    std::vector<index_feature,_std::allocator<index_feature>_>::begin
              ((vector<index_feature,_std::allocator<index_feature>_> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    std::vector<index_feature,_std::allocator<index_feature>_>::end
              ((vector<index_feature,_std::allocator<index_feature>_> *)
               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    __first._M_current._7_1_ = in_stack_fffffffffffffe17;
    __first._M_current._0_7_ = in_stack_fffffffffffffe10;
    std::
    sort<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>>
              (__first,in_stack_fffffffffffffe08);
    lVar2 = *(long *)&(in_RDI->trace_message).super_ostream.field_0xa8;
    fVar20 = *(float *)(lVar2 + 0x3560);
    fVar19 = lda::powf((lda *)in_RDI,
                       (float)*(double *)&(in_RDI->trace_message).super_ostream.field_0xa0,
                       -*(float *)(lVar2 + 0x334));
    fVar20 = fVar20 * fVar19;
    fVar19 = 1.0 - fVar20;
    local_150 = (float)sVar7;
    fVar20 = fVar20 * (*(float *)&(in_RDI->parse_thread)._M_id._M_thread / local_150);
    v_array<float>::last((v_array<float> *)&in_RDI->current_pass);
    std::log((double)(ulong)(uint)fVar19);
    v_array<float>::push_back
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    v_array<float>::clear
              ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    vw::length(*(vw **)&(in_RDI->trace_message).super_ostream.field_0xa8);
    for (local_88 = 0;
        local_88 < *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
        local_88 = local_88 + 1) {
      in_stack_fffffffffffffe80 = in_RDI;
      v_array<float>::operator[]((v_array<float> *)&(in_RDI->id)._M_string_length,local_88);
      lda::digamma((lda *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0.0);
      v_array<float>::push_back
                ((v_array<float> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    }
    local_98 = (uchar *)0xffffffffffffffff;
    peVar11 = (example *)
              std::vector<index_feature,_std::allocator<index_feature>_>::operator[]
                        ((vector<index_feature,_std::allocator<index_feature>_> *)
                         &(in_RDI->trace_message).super_ostream.field_0x48,0);
    while (l_00 = peVar11,
          peVar12 = (example *)
                    std::vector<index_feature,_std::allocator<index_feature>_>::back
                              ((vector<index_feature,_std::allocator<index_feature>_> *)
                               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)),
          peVar11 <= peVar12) {
      if (local_98 != (l_00->super_example_predict).indices.end_array) {
        local_98 = (l_00->super_example_predict).indices.end_array;
        this_00 = (lda *)(l_00->super_example_predict).indices.end_array;
        parameters::mask((parameters *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                        );
        in_stack_ffffffffffffff58 =
             (v_array<float> *)
             parameters::operator[]
                       ((parameters *)in_stack_fffffffffffffe08._M_current,
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        ppfVar13 = v_array<float>::end((v_array<float> *)&in_RDI->current_pass);
        in_stack_ffffffffffffff54 = (*ppfVar13)[-2];
        ppfVar13 = v_array<float>::end((v_array<float> *)&in_RDI->current_pass);
        in_stack_ffffffffffffff54 =
             in_stack_ffffffffffffff54 -
             (*ppfVar13)
             [(int)((-1.0 - *(double *)&(in_RDI->trace_message).super_ostream.field_0xa0) +
                   (double)*(float *)((long)&in_stack_ffffffffffffff58->_begin +
                                     (ulong)*(uint *)(*(long *)&(in_RDI->trace_message).
                                                                super_ostream.field_0xa8 + 0x3478) *
                                     4))];
        dVar24 = std::exp((double)(ulong)(uint)in_stack_ffffffffffffff54);
        dVar24 = std::fmin(5.26354424712089e-315,dVar24);
        in_stack_ffffffffffffff50 = SUB84(dVar24,0);
        peVar11 = (example *)
                  ((long)&in_stack_ffffffffffffff58->_begin +
                  (ulong)*(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 +
                                  0x3478) * 4 + 4);
        *(float *)((long)&in_stack_ffffffffffffff58->_begin +
                  (ulong)*(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 +
                                  0x3478) * 4) =
             (float)*(double *)&(in_RDI->trace_message).super_ostream.field_0xa0;
        for (in_stack_ffffffffffffff40 = 0;
            in_stack_ffffffffffffff40 <
            *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
            in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
          *(float *)((long)&in_stack_ffffffffffffff58->_begin + in_stack_ffffffffffffff40 * 4) =
               in_stack_ffffffffffffff50 *
               *(float *)((long)&in_stack_ffffffffffffff58->_begin + in_stack_ffffffffffffff40 * 4);
          *(float *)((long)(peVar11->super_example_predict).feature_space +
                    in_stack_ffffffffffffff40 * 4 + -0x20) =
               *(float *)((long)&in_stack_ffffffffffffff58->_begin + in_stack_ffffffffffffff40 * 4)
               + *(float *)((long)&in_RDI->p + 4);
        }
        pfVar10 = *(float **)&(in_RDI->trace_message).super_ostream.field_0xa8;
        pvVar14 = in_RDI;
        in_stack_ffffffffffffff48 = peVar11;
        v_array<float>::begin((v_array<float> *)&(in_RDI->trace_message).super_ostream.field_0x8);
        lda::expdigammify_2(this_00,(vw *)peVar11,pfVar10,(float *)pvVar14);
      }
      peVar11 = (example *)&(l_00->super_example_predict).indices.erase_count;
    }
    for (local_c8 = 0; local_c8 < sVar7; local_c8 = local_c8 + 1) {
      peVar12 = (example *)&in_RDI->l;
      pvVar14 = (vw *)v_array<float>::operator[]
                                ((v_array<float> *)&(in_RDI->trace_message).super_ostream.field_0x28
                                 ,local_c8 *
                                  *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.
                                                      field_0xa8 + 0x3478));
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,local_c8);
      fVar21 = lda_loop((lda *)l_00,in_stack_ffffffffffffff58,
                        (float *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,(float)(in_stack_ffffffffffffff40 >> 0x20));
      if ((*(byte *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3438) & 1) != 0)
      {
        v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,local_c8);
        GD::print_audit_features(pvVar14,peVar12);
      }
      piVar15 = v_array<int>::operator[]((v_array<int> *)&(in_RDI->model_file_ver).rev,local_c8);
      if (0 < *piVar15) {
        lVar2 = **(long **)&(in_RDI->trace_message).super_ostream.field_0xa8;
        *(double *)(lVar2 + 0x40) = *(double *)(lVar2 + 0x40) - (double)fVar21;
        lVar2 = **(long **)&(in_RDI->trace_message).super_ostream.field_0xa8;
        *(double *)(lVar2 + 0x48) = *(double *)(lVar2 + 0x48) - (double)fVar21;
      }
      in_stack_fffffffffffffe20 =
           *(vector<index_feature,_std::allocator<index_feature>_> **)
            &(in_RDI->trace_message).super_ostream.field_0xa8;
      v_array<example_*>::operator[]((v_array<example_*> *)&in_RDI->num_children,local_c8);
      return_example(in_stack_fffffffffffffe80,peVar11);
    }
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      local_d8 = std::vector<index_feature,_std::allocator<index_feature>_>::operator[]
                           ((vector<index_feature,_std::allocator<index_feature>_> *)
                            &(in_RDI->trace_message).super_ostream.field_0x48,0);
      while (in_stack_fffffffffffffe18 = local_d8,
            pvVar16 = std::vector<index_feature,_std::allocator<index_feature>_>::back
                                ((vector<index_feature,_std::allocator<index_feature>_> *)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)),
            pvVar3 = local_d8, in_stack_fffffffffffffe18 <= pvVar16) {
        do {
          pvVar16 = pvVar3 + 1;
          this = (parameters *)pvVar16;
          ppVar17 = (parameters *)
                    std::vector<index_feature,_std::allocator<index_feature>_>::back
                              ((vector<index_feature,_std::allocator<index_feature>_> *)
                               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          bVar4 = false;
          if (this <= ppVar17) {
            bVar4 = pvVar3[1].f.weight_index == (local_d8->f).weight_index;
          }
          pvVar3 = pvVar16;
        } while (bVar4);
        local_e8 = parameters::operator[]
                             (this,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        for (local_f0 = 0;
            local_f0 <
            *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
            local_f0 = local_f0 + 1) {
          *local_e8 = fVar19 * *local_e8;
          local_e8 = local_e8 + 1;
        }
        for (; local_d8 != pvVar16; local_d8 = local_d8 + 1) {
          pfVar10 = v_array<float>::operator[]
                              ((v_array<float> *)&(in_RDI->trace_message).super_ostream.field_0x28,
                               (ulong)(local_d8->document *
                                      *(int *)(*(long *)&(in_RDI->trace_message).super_ostream.
                                                         field_0xa8 + 0x3478)));
          pwVar9 = parameters::operator[]
                             (this,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          local_108 = pwVar9 + *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8
                                        + 0x3478);
          in_stack_fffffffffffffe04 = fVar20;
          fVar22 = find_cw((lda *)CONCAT44(fVar20,in_stack_fffffffffffffe00),
                           (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           (float *)0x218cb9);
          fVar22 = in_stack_fffffffffffffe04 * fVar22;
          fVar21 = (local_d8->f).x;
          local_e8 = parameters::operator[]
                               (this,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
          for (local_118 = 0; local_108 = local_108 + 1,
              local_118 <
              *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478);
              local_118 = local_118 + 1) {
            fVar23 = *local_108 * pfVar10[local_118] * fVar22 * fVar21;
            in_stack_fffffffffffffe00 = fVar23;
            pfVar18 = v_array<float>::operator[]
                                ((v_array<float> *)&(in_RDI->data_filename)._M_string_length,
                                 local_118);
            *pfVar18 = in_stack_fffffffffffffe00 + *pfVar18;
            *local_e8 = fVar23 + *local_e8;
            local_e8 = local_e8 + 1;
          }
        }
      }
      for (local_128 = 0;
          local_128 < *(uint *)(*(long *)&(in_RDI->trace_message).super_ostream.field_0xa8 + 0x3478)
          ; local_128 = local_128 + 1) {
        fVar20 = fVar19;
        pfVar10 = v_array<float>::operator[]
                            ((v_array<float> *)&(in_RDI->id)._M_string_length,local_128);
        *pfVar10 = fVar20 * *pfVar10;
        pfVar10 = v_array<float>::operator[]
                            ((v_array<float> *)&(in_RDI->data_filename)._M_string_length,local_128);
        fVar20 = *pfVar10;
        pfVar10 = v_array<float>::operator[]
                            ((v_array<float> *)&(in_RDI->id)._M_string_length,local_128);
        *pfVar10 = fVar20 + *pfVar10;
      }
    }
    std::vector<index_feature,_std::allocator<index_feature>_>::resize
              (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
    v_array<example_*>::clear
              ((v_array<example_*> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    v_array<int>::clear((v_array<int> *)
                        CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  return;
}

Assistant:

void learn_batch(lda &l)
{
  parameters &weights = l.all->weights;
  if (l.sorted_features.empty())  // FAST-PASS for real "true"
  {
    // This can happen when the socket connection is dropped by the client.
    // If l.sorted_features is empty, then l.sorted_features[0] does not
    // exist, so we should not try to take its address in the beginning of
    // the for loops down there. Since it seems that there's not much to
    // do in this case, we just return.
    for (size_t d = 0; d < l.examples.size(); d++)
    {
      l.examples[d]->pred.scalars.clear();
      l.examples[d]->pred.scalars.resize(l.topics);
      memset(l.examples[d]->pred.scalars.begin(), 0, l.topics * sizeof(float));
      l.examples[d]->pred.scalars.end() = l.examples[d]->pred.scalars.begin() + l.topics;

      l.examples[d]->pred.scalars.clear();
      return_example(*l.all, *l.examples[d]);
    }
    l.examples.clear();
    return;
  }

  float eta = -1;
  float minuseta = -1;

  if (l.total_lambda.size() == 0)
  {
    for (size_t k = 0; k < l.all->lda; k++) l.total_lambda.push_back(0.f);
    // This part does not work with sparse parameters
    size_t stride = weights.stride();
    for (size_t i = 0; i <= weights.mask(); i += stride)
    {
      weight *w = &(weights[i]);
      for (size_t k = 0; k < l.all->lda; k++) l.total_lambda[k] += w[k];
    }
  }

  l.example_t++;
  l.total_new.clear();
  for (size_t k = 0; k < l.all->lda; k++) l.total_new.push_back(0.f);

  size_t batch_size = l.examples.size();

  sort(l.sorted_features.begin(), l.sorted_features.end());

  eta = l.all->eta * l.powf((float)l.example_t, -l.all->power_t);
  minuseta = 1.0f - eta;
  eta *= l.lda_D / batch_size;
  l.decay_levels.push_back(l.decay_levels.last() + log(minuseta));

  l.digammas.clear();
  float additional = (float)(l.all->length()) * l.lda_rho;
  for (size_t i = 0; i < l.all->lda; i++) l.digammas.push_back(l.digamma(l.total_lambda[i] + additional));

  uint64_t last_weight_index = -1;
  for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back(); s++)
  {
    if (last_weight_index == s->f.weight_index)
      continue;
    last_weight_index = s->f.weight_index;
    // float *weights_for_w = &(weights[s->f.weight_index]);
    float *weights_for_w = &(weights[s->f.weight_index & weights.mask()]);
    float decay_component =
        l.decay_levels.end()[-2] - l.decay_levels.end()[(int)(-1 - l.example_t + *(weights_for_w + l.all->lda))];
    float decay = fmin(1.0f, correctedExp(decay_component));
    float *u_for_w = weights_for_w + l.all->lda + 1;

    *(weights_for_w + l.all->lda) = (float)l.example_t;
    for (size_t k = 0; k < l.all->lda; k++)
    {
      weights_for_w[k] *= decay;
      u_for_w[k] = weights_for_w[k] + l.lda_rho;
    }

    l.expdigammify_2(*l.all, u_for_w, l.digammas.begin());
  }

  for (size_t d = 0; d < batch_size; d++)
  {
    float score = lda_loop(l, l.Elogtheta, &(l.v[d * l.all->lda]), l.examples[d], l.all->power_t);
    if (l.all->audit)
      GD::print_audit_features(*l.all, *l.examples[d]);
    // If the doc is empty, give it loss of 0.
    if (l.doc_lengths[d] > 0)
    {
      l.all->sd->sum_loss -= score;
      l.all->sd->sum_loss_since_last_dump -= score;
    }
    return_example(*l.all, *l.examples[d]);
  }

  // -t there's no need to update weights (especially since it's a noop)
  if (eta != 0)
  {
    for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back();)
    {
      index_feature *next = s + 1;
      while (next <= &l.sorted_features.back() && next->f.weight_index == s->f.weight_index) next++;

      float *word_weights = &(weights[s->f.weight_index]);
      for (size_t k = 0; k < l.all->lda; k++, ++word_weights)
      {
        float new_value = minuseta * *word_weights;
        *word_weights = new_value;
      }

      for (; s != next; s++)
      {
        float *v_s = &(l.v[s->document * l.all->lda]);
        float *u_for_w = &(weights[s->f.weight_index]) + l.all->lda + 1;
        float c_w = eta * find_cw(l, u_for_w, v_s) * s->f.x;
        word_weights = &(weights[s->f.weight_index]);
        for (size_t k = 0; k < l.all->lda; k++, ++u_for_w, ++word_weights)
        {
          float new_value = *u_for_w * v_s[k] * c_w;
          l.total_new[k] += new_value;
          *word_weights += new_value;
        }
      }
    }

    for (size_t k = 0; k < l.all->lda; k++)
    {
      l.total_lambda[k] *= minuseta;
      l.total_lambda[k] += l.total_new[k];
    }
  }
  l.sorted_features.resize(0);

  l.examples.clear();
  l.doc_lengths.clear();
}